

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O2

void __thiscall anurbs::RTree<3L>::add(RTree<3L> *this,Vector *box_a,Vector *box_b)

{
  double dVar1;
  Scalar SVar2;
  pointer plVar3;
  CoeffReturnType pdVar4;
  Scalar *pSVar5;
  DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *this_00;
  Index i;
  long index;
  Index i_1;
  long lVar6;
  DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *this_01;
  Vector box_max;
  Vector box_min;
  DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> local_60 [24];
  DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> local_48 [24];
  
  lVar6 = this->m_position;
  plVar3 = (this->m_indices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  this->m_position = lVar6 + 1;
  plVar3[lVar6] = lVar6;
  for (index = 0; index != 3; index = index + 1) {
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_a,index);
    dVar1 = *pdVar4;
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_b,index);
    this_00 = (DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_a;
    this_01 = (DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_b;
    if (*pdVar4 <= dVar1) {
      this_00 = (DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_b;
      this_01 = (DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)box_a;
    }
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                       (this_00,index);
    dVar1 = *pdVar4;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                       (local_48,index);
    *pSVar5 = dVar1;
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                       (this_01,index);
    dVar1 = *pdVar4;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                       (local_60,index);
    *pSVar5 = dVar1;
  }
  Eigen::internal::call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>
            ((this->m_boxes_min).
             super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar6,
             (Matrix<double,_1,_3,_1,_1,_3> *)local_48);
  Eigen::internal::call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>
            ((this->m_boxes_max).
             super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar6,
             (Matrix<double,_1,_3,_1,_1,_3> *)local_60);
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                       (local_48,lVar6);
    dVar1 = *pSVar5;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&this->m_min,
                        lVar6);
    if (dVar1 < *pSVar5) {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         (local_48,lVar6);
      SVar2 = *pSVar5;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&this->m_min,
                          lVar6);
      *pSVar5 = SVar2;
    }
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                       (local_60,lVar6);
    dVar1 = *pSVar5;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&this->m_max,
                        lVar6);
    if (*pSVar5 <= dVar1 && dVar1 != *pSVar5) {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         (local_60,lVar6);
      SVar2 = *pSVar5;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&this->m_max,
                          lVar6);
      *pSVar5 = SVar2;
    }
  }
  return;
}

Assistant:

void add(const Vector box_a, const Vector box_b)
    {
        // FIXME: check m_position

        Index index = m_position++;

        m_indices[index] = index;

        Vector box_min;
        Vector box_max;

        for (Index i = 0; i < dimension(); i++) {
            if (box_a[i] < box_b[i]) {
                box_min[i] = box_a[i];
                box_max[i] = box_b[i];
            } else {
                box_min[i] = box_b[i];
                box_max[i] = box_a[i];
            }
        }

        m_boxes_min[index] = box_min;
        m_boxes_max[index] = box_max;

        for (Index i = 0; i < dimension(); i++) {
            if (box_min[i] < m_min[i]) {
                m_min[i] = box_min[i];
            }
            if (box_max[i] > m_max[i]) {
                m_max[i] = box_max[i];
            }
        }
    }